

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_marked(REF_SHARD ref_shard,REF_INT node0,REF_INT node1,REF_BOOL *marked)

{
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  long lVar4;
  REF_INT face;
  int local_2c;
  
  *marked = 0;
  uVar3 = ref_face_spanning(ref_shard->face,node0,node1,&local_2c);
  if (uVar3 == 0) {
    pRVar1 = ref_shard->mark;
    lVar4 = (long)local_2c;
    uVar3 = pRVar1[lVar4];
    if (uVar3 != 0) {
      if (((uVar3 == 2) && (pRVar2 = ref_shard->face->f2n, pRVar2[lVar4 * 4 + 2] == node0)) &&
         (pRVar2[local_2c * 4] == node1)) {
        *marked = 1;
      }
      if (((pRVar1[lVar4] == 2) && (pRVar2 = ref_shard->face->f2n, pRVar2[lVar4 * 4 + 2] == node1))
         && (pRVar2[local_2c * 4] == node0)) {
        *marked = 1;
      }
      if (((pRVar1[lVar4] == 3) &&
          (pRVar2 = ref_shard->face->f2n, pRVar2[local_2c * 4 + 3] == node0)) &&
         (pRVar2[(int)(local_2c * 4 | 1)] == node1)) {
        *marked = 1;
      }
      uVar3 = 0;
      if (((pRVar1[lVar4] == 3) &&
          (pRVar1 = ref_shard->face->f2n, pRVar1[local_2c * 4 + 3] == node1)) &&
         (uVar3 = 0, pRVar1[(int)(local_2c << 2 | 1)] == node0)) {
        *marked = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x60,
           "ref_shard_marked",(ulong)uVar3,"missing face");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_shard_marked(REF_SHARD ref_shard, REF_INT node0,
                                    REF_INT node1, REF_BOOL *marked) {
  REF_INT face;

  *marked = REF_FALSE;

  RSS(ref_face_spanning(ref_shard_face(ref_shard), node0, node1, &face),
      "missing face");

  if (0 == ref_shard_mark(ref_shard, face)) return REF_SUCCESS;

  if (2 == ref_shard_mark(ref_shard, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 0, face))
    *marked = REF_TRUE;

  if (2 == ref_shard_mark(ref_shard, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 2, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 0, face))
    *marked = REF_TRUE;

  if (3 == ref_shard_mark(ref_shard, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 1, face))
    *marked = REF_TRUE;

  if (3 == ref_shard_mark(ref_shard, face) &&
      node1 == ref_face_f2n(ref_shard_face(ref_shard), 3, face) &&
      node0 == ref_face_f2n(ref_shard_face(ref_shard), 1, face))
    *marked = REF_TRUE;

  return REF_SUCCESS;
}